

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,UnicodeString *varTop,UErrorCode *errorCode)

{
  ushort uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint32_t uVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  uVar1 = (varTop->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar3 = (varTop->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&varTop->fUnion + 2);
    }
  }
  else {
    pcVar3 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar4 = (varTop->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)(short)uVar1 >> 5;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Collator).super_UObject._vptr_UObject[0x1b];
  uVar2 = (*UNRECOVERED_JUMPTABLE)(this,pcVar3,(ulong)uVar4,errorCode,UNRECOVERED_JUMPTABLE);
  return uVar2;
}

Assistant:

uint32_t
RuleBasedCollator::setVariableTop(const UnicodeString &varTop, UErrorCode &errorCode) {
    return setVariableTop(varTop.getBuffer(), varTop.length(), errorCode);
}